

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O0

void __thiscall FIX::Dictionary::setBool(Dictionary *this,string *key,bool value)

{
  mapped_type *this_00;
  string local_80;
  string local_60;
  string local_40;
  undefined1 local_19;
  string *psStack_18;
  bool value_local;
  string *key_local;
  Dictionary *this_local;
  
  local_19 = value;
  psStack_18 = key;
  key_local = (string *)this;
  BoolConvertor::convert_abi_cxx11_(&local_40,(BoolConvertor *)(ulong)(value & 1),value);
  string_toUpper(&local_80,psStack_18);
  string_strip(&local_60,&local_80);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_data,&local_60);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Dictionary::setBool(const std::string &key, bool value) {
  m_data[string_strip(string_toUpper(key))] = BoolConvertor::convert(value);
}